

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

ResetPtr __thiscall libcellml::Component::takeReset(Component *this,size_t index)

{
  ComponentImpl *pCVar1;
  size_type sVar2;
  reference pvVar3;
  element_type *this_00;
  ResetImpl *this_01;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ResetPtr RVar5;
  size_t index_local;
  Component *this_local;
  ResetPtr *reset;
  
  std::shared_ptr<libcellml::Reset>::shared_ptr((shared_ptr<libcellml::Reset> *)this,(nullptr_t)0x0)
  ;
  pCVar1 = pFunc((Component *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
          ::size(&pCVar1->mResets);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pCVar1 = pFunc((Component *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ::at(&pCVar1->mResets,in_RDX);
    std::shared_ptr<libcellml::Reset>::operator=((shared_ptr<libcellml::Reset> *)this,pvVar3);
    removeReset((Component *)index,in_RDX);
    this_00 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    this_01 = Reset::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_01->super_ParentedEntityImpl);
    _Var4._M_pi = extraout_RDX_00;
  }
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Component::takeReset(size_t index)
{
    ResetPtr reset = nullptr;
    if (index < pFunc()->mResets.size()) {
        reset = pFunc()->mResets.at(index);
        removeReset(index);
        reset->pFunc()->removeParent();
    }

    return reset;
}